

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

void anon_unknown.dwarf_153727::ReportAt
               (ParseContext *ctx,Lexeme *begin,Lexeme *end,char *pos,char *msg,__va_list_tag *args)

{
  char *__s;
  Allocator *pAVar1;
  int iVar2;
  uint uVar3;
  ErrorInfo **ppEVar4;
  size_t sVar5;
  undefined4 extraout_var;
  char *pcVar6;
  ErrorInfo *local_38;
  
  pcVar6 = ctx->errorBuf;
  if ((pcVar6 != (char *)0x0) && (uVar3 = ctx->errorBufSize, uVar3 != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = pos;
      ctx->errorBufLocation = pcVar6;
    }
    if ((ctx->errorInfo).count != 0) {
      ppEVar4 = SmallArray<ErrorInfo_*,_4U>::back(&ctx->errorInfo);
      if ((*ppEVar4)->pos == pos) {
        return;
      }
      uVar3 = ctx->errorBufSize;
      pcVar6 = ctx->errorBuf;
    }
    __s = ctx->errorBufLocation;
    vsnprintf(__s,(ulong)(((int)pcVar6 - (int)__s) + uVar3),msg,args);
    ctx->errorBuf[ctx->errorBufSize - 1] = '\0';
    pcVar6 = ctx->errorBufLocation;
    sVar5 = strlen(pcVar6);
    pcVar6 = pcVar6 + sVar5;
    ctx->errorBufLocation = pcVar6;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    local_38 = (ErrorInfo *)CONCAT44(extraout_var,iVar2);
    pAVar1 = ctx->allocator;
    local_38->messageStart = __s;
    local_38->messageEnd = pcVar6;
    local_38->begin = begin;
    local_38->end = end;
    local_38->pos = pos;
    (local_38->related).allocator = pAVar1;
    (local_38->related).data = (local_38->related).little;
    (local_38->related).count = 0;
    (local_38->related).max = 4;
    local_38->parentModule = (ModuleData *)0x0;
    SmallArray<ErrorInfo_*,_4U>::push_back(&ctx->errorInfo,&local_38);
    AddErrorLocationInfo
              (ctx->code,pos,ctx->errorBufLocation,
               (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
    pcVar6 = ctx->errorBufLocation;
    sVar5 = strlen(pcVar6);
    ctx->errorBufLocation = pcVar6 + sVar5;
  }
  uVar3 = ctx->errorCount + 1;
  ctx->errorCount = uVar3;
  if (uVar3 != 100) {
    return;
  }
  NULLC::SafeSprintf(ctx->errorBufLocation,
                     (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                            ctx->errorBufSize),"ERROR: error limit reached");
  pcVar6 = ctx->errorBufLocation;
  sVar5 = strlen(pcVar6);
  ctx->errorBufLocation = pcVar6 + sVar5;
  if (ctx->errorHandlerActive == false) {
    __assert_fail("ctx.errorHandlerActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0x37,
                  "void (anonymous namespace)::ReportAt(ParseContext &, Lexeme *, Lexeme *, const char *, const char *, __va_list_tag *)"
                 );
  }
  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
}

Assistant:

void ReportAt(ParseContext &ctx, Lexeme *begin, Lexeme *end, const char *pos, const char *msg, va_list args)
	{
		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = pos;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			// Don't report multiple errors at the same position
			if(!ctx.errorInfo.empty() && ctx.errorInfo.back()->pos == pos)
				return;

			const char *messageStart = ctx.errorBufLocation;

			vsnprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), msg, args);
			ctx.errorBuf[ctx.errorBufSize - 1] = '\0';

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			const char *messageEnd = ctx.errorBufLocation;

			ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, begin, end, pos));

			AddErrorLocationInfo(ctx.code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);
		}

		ctx.errorCount++;

		if(ctx.errorCount == 100)
		{
			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: error limit reached");

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}